

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soap_ctrlpt.c
# Opt level: O1

int get_response_value(http_message_t *hmsg,int code,char *name,int *upnp_error_code,
                      IXML_Node **action_value,char **str_value)

{
  int iVar1;
  int iVar2;
  int iVar3;
  IXML_Node *pIVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  char cVar8;
  IXML_Node *node;
  IXML_Document *doc;
  IXML_Node *error_node;
  char *names [5];
  IXML_Node *local_80;
  char **local_78;
  IXML_Node *local_70;
  IXML_Node *local_68;
  int *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  pcVar5 = (char *)0x0;
  local_80 = (IXML_Node *)0x0;
  local_68 = (IXML_Node *)0x0;
  local_70 = (IXML_Node *)0x0;
  iVar2 = -0x71;
  if ((hmsg->status_code == 500) || (hmsg->status_code == 200)) {
    local_78 = str_value;
    local_60 = upnp_error_code;
    iVar1 = has_xml_content_type(hmsg);
    if ((iVar1 == 0) ||
       ((iVar1 = ixmlParseBufferEx((hmsg->entity).buf,(IXML_Document **)&local_70), iVar1 != 0 ||
        (pIVar4 = ixmlNode_getFirstChild(local_70), pIVar4 == (IXML_Node *)0x0)))) {
LAB_0011be3c:
      pcVar5 = (char *)0x0;
    }
    else {
      if (code == 1) {
        if (action_value == (IXML_Node **)0x0) {
          __assert_fail("action_value != NULL",".upnp/src/soap/soap_ctrlpt.c",0x18c,
                        "int get_response_value(http_message_t *, int, char *, int *, IXML_Node **, char **)"
                       );
        }
        *action_value = (IXML_Node *)0x0;
        local_58 = "Envelope";
        local_50 = "Body";
        local_48 = name;
        iVar2 = dom_find_deep_node(&local_58,3,pIVar4,&local_80);
        if (iVar2 == 0) {
          pcVar5 = ixmlPrintNode(local_80);
          if (pcVar5 == (char *)0x0) {
            iVar2 = -0x68;
            goto LAB_0011be3c;
          }
          iVar2 = ixmlParseBufferEx(pcVar5,(IXML_Document **)action_value);
          pcVar6 = (char *)0x0;
          if (iVar2 != 0) {
            iVar2 = -0x71;
            goto LAB_0011be41;
          }
          iVar7 = 1;
          iVar1 = 1;
        }
        else {
LAB_0011bf61:
          pcVar6 = (char *)0x1;
          iVar7 = -0x71;
          iVar1 = -0x71;
          pcVar5 = (char *)0x0;
        }
        cVar8 = (char)pcVar6;
      }
      else {
        if (local_78 == (char **)0x0) {
          __assert_fail("str_value != NULL",".upnp/src/soap/soap_ctrlpt.c",0x1a4,
                        "int get_response_value(http_message_t *, int, char *, int *, IXML_Node **, char **)"
                       );
        }
        *local_78 = (char *)0x0;
        local_58 = "Envelope";
        local_50 = "Body";
        local_48 = "QueryStateVariableResponse";
        local_40 = "return";
        iVar2 = dom_find_deep_node(&local_58,4,pIVar4,&local_80);
        if (iVar2 != 0) goto LAB_0011bf61;
        pcVar5 = get_node_value(local_80);
        if (pcVar5 == (char *)0x0) {
          iVar2 = -0x71;
          goto LAB_0011be3c;
        }
        pcVar5 = ixmlCloneDOMString(pcVar5);
        *local_78 = pcVar5;
        iVar7 = 2;
        iVar1 = 2;
        pcVar5 = (char *)0x0;
        cVar8 = '\0';
      }
      iVar2 = iVar1;
      if (cVar8 != '\0') {
        *local_78 = (char *)0x0;
        local_58 = "Envelope";
        local_50 = "Body";
        local_48 = "Fault";
        local_40 = "detail";
        local_38 = "UPnPError";
        iVar3 = dom_find_deep_node(&local_58,5,pIVar4,&local_68);
        pIVar4 = local_68;
        if (((iVar3 == 0) && (iVar3 = dom_find_node("errorCode",local_68,&local_80), iVar3 == 0)) &&
           (pcVar6 = get_node_value(local_80), pcVar6 != (char *)0x0)) {
          iVar2 = atoi(pcVar6);
          *local_60 = iVar2;
          if (400 < iVar2) {
            pcVar6 = (char *)0x0;
            goto LAB_0011be41;
          }
          if (code == 2) {
            iVar3 = dom_find_node("errorDescription",pIVar4,&local_80);
            iVar2 = iVar1;
            if ((iVar3 == 0) && (pcVar6 = get_node_value(local_80), pcVar6 != (char *)0x0)) {
              pcVar6 = ixmlCloneDOMString(pcVar6);
              *local_78 = pcVar6;
              iVar2 = iVar7;
              if (pcVar6 != (char *)0x0) {
                iVar2 = 4;
              }
            }
          }
          else {
            iVar2 = iVar1;
            if (code == 1) {
              pcVar6 = ixmlPrintNode(pIVar4);
              if (pcVar6 != (char *)0x0) {
                iVar1 = ixmlParseBufferEx(pcVar6,(IXML_Document **)action_value);
                iVar2 = -0x71;
                if (iVar1 == 0) {
                  iVar2 = 3;
                }
                goto LAB_0011be41;
              }
              iVar2 = -0x68;
            }
          }
        }
      }
    }
  }
  pcVar6 = (char *)0x0;
LAB_0011be41:
  ixmlDocument_free((IXML_Document *)local_70);
  ixmlFreeDOMString(pcVar5);
  ixmlFreeDOMString(pcVar6);
  return iVar2;
}

Assistant:

static int get_response_value(http_message_t *hmsg,
	int code,
	char *name,
	int *upnp_error_code,
	IXML_Node **action_value,
	DOMString *str_value)
{
	IXML_Node *node = NULL;
	IXML_Node *root_node = NULL;
	IXML_Node *error_node = NULL;
	IXML_Document *doc = NULL;
	char *node_str = NULL;
	const char *temp_str = NULL;
	DOMString error_node_str = NULL;
	int err_code = UPNP_E_BAD_RESPONSE; /* default error */
	int done = 0;
	const char *names[5];
	const DOMString nodeValue;

	/* only 200 and 500 status codes are relevant */
	if ((hmsg->status_code != HTTP_OK &&
		    hmsg->status_code != HTTP_INTERNAL_SERVER_ERROR) ||
		!has_xml_content_type(hmsg))
		goto error_handler;
	if (ixmlParseBufferEx(hmsg->entity.buf, &doc) != IXML_SUCCESS)
		goto error_handler;
	root_node = ixmlNode_getFirstChild((IXML_Node *)doc);
	if (root_node == NULL)
		goto error_handler;
	if (code == SOAP_ACTION_RESP) {
		/* try reading soap action response */
		assert(action_value != NULL);

		*action_value = NULL;
		names[0] = "Envelope";
		names[1] = "Body";
		names[2] = name;
		if (dom_find_deep_node(names, 3, root_node, &node) ==
			UPNP_E_SUCCESS) {
			node_str = ixmlPrintNode(node);
			if (node_str == NULL) {
				err_code = UPNP_E_OUTOF_MEMORY;
				goto error_handler;
			}
			if (ixmlParseBufferEx(
				    node_str, (IXML_Document **)action_value) !=
				IXML_SUCCESS) {
				err_code = UPNP_E_BAD_RESPONSE;
				goto error_handler;
			}
			err_code = SOAP_ACTION_RESP;
			done = 1;
		}
	} else if (code == SOAP_VAR_RESP) {
		/* try reading var response */
		assert(str_value != NULL);

		*str_value = NULL;
		names[0] = "Envelope";
		names[1] = "Body";
		names[2] = "QueryStateVariableResponse";
		names[3] = "return";
		if (dom_find_deep_node(names, 4, root_node, &node) ==
			UPNP_E_SUCCESS) {
			nodeValue = get_node_value(node);
			if (nodeValue == NULL)
				goto error_handler;
			*str_value = ixmlCloneDOMString(nodeValue);
			err_code = SOAP_VAR_RESP;
			done = 1;
		}
	}
	if (!done) {
		/* not action or var resp; read error code and description */
		*str_value = NULL;
		names[0] = "Envelope";
		names[1] = "Body";
		names[2] = "Fault";
		names[3] = "detail";
		names[4] = "UPnPError";
		if (dom_find_deep_node(names, 5, root_node, &error_node) !=
			UPNP_E_SUCCESS)
			goto error_handler;
		if (dom_find_node("errorCode", error_node, &node) !=
			UPNP_E_SUCCESS)
			goto error_handler;
		temp_str = get_node_value(node);
		if (!temp_str)
			goto error_handler;
		*upnp_error_code = atoi(temp_str);
		if (*upnp_error_code > 400) {
			err_code = *upnp_error_code;
			goto error_handler; /* bad SOAP error code */
		}
		if (code == SOAP_VAR_RESP) {
			if (dom_find_node("errorDescription",
				    error_node,
				    &node) != UPNP_E_SUCCESS) {
				goto error_handler;
			}
			nodeValue = get_node_value(node);
			if (nodeValue == NULL) {
				goto error_handler;
			}
			*str_value = ixmlCloneDOMString(nodeValue);
			if (*str_value == NULL) {
				goto error_handler;
			}
			err_code = SOAP_VAR_RESP_ERROR;
		} else if (code == SOAP_ACTION_RESP) {
			error_node_str = ixmlPrintNode(error_node);
			if (error_node_str == NULL) {
				err_code = UPNP_E_OUTOF_MEMORY;
				goto error_handler;
			}
			if (ixmlParseBufferEx(error_node_str,
				    (IXML_Document **)action_value) !=
				IXML_SUCCESS) {
				err_code = UPNP_E_BAD_RESPONSE;

				goto error_handler;
			}
			err_code = SOAP_ACTION_RESP_ERROR;
		}
	}

error_handler:
	ixmlDocument_free(doc);
	ixmlFreeDOMString(node_str);
	ixmlFreeDOMString(error_node_str);
	return err_code;
}